

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest-sha512.c
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  uint8_t *__s2;
  uint8_t checkhash [64];
  sha512 h;
  
  lVar2 = -0x80;
  __s2 = table[0].hash;
  while( true ) {
    if (lVar2 == 0) {
      return 0;
    }
    sha512_init(&h);
    sha512_add(&h,__s2 + -0x4000,(long)((anon_struct_16452_3_6bb04327 *)(__s2 + -0x4004))->len);
    sha512_final(&h,checkhash);
    iVar1 = bcmp(checkhash,__s2,0x40);
    if (iVar1 != 0) break;
    lVar2 = lVar2 + 1;
    __s2 = __s2 + 0x4044;
  }
  fprintf(_stderr,"sha512-selftest: can\'t verify hash number %d\n",(ulong)((int)lVar2 + 0x81));
  return 1;
}

Assistant:

int main()
{
	struct sha512 h;
	uint8_t checkhash[SHA512_HASH_LENGTH];
	int i;

	for (i = 0; i < table_num; i++) {
		sha512_init(&h);
		sha512_add(&h, table[i].buffer, table[i].len);
		sha512_final(&h, checkhash);

		if (memcmp(checkhash, table[i].hash, SHA512_HASH_LENGTH) != 0) {
			fprintf(stderr, "sha512-selftest: can't verify hash number %d\n", i+1);
			return 1;
		}
	}

	return 0;
}